

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::insertChunks
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *png,
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *chunks)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  iterator __first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RSI;
  size_t i_2;
  size_t i_1;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string name;
  char type [5];
  long l2;
  long l1;
  long l0;
  uchar *end;
  uchar *begin;
  uchar *next;
  uchar *chunk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd58;
  iterator in_stack_fffffffffffffd60;
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffd98;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffda0;
  const_iterator in_stack_fffffffffffffda8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 uVar5;
  ulong local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_148;
  ulong local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  int local_90;
  undefined1 local_79 [36];
  char local_55 [5];
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  reference local_38;
  reference local_30;
  uchar *local_28;
  uchar *local_20;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  local_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffd50);
  local_38 = local_38 + 1;
  local_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffd50);
  local_30 = local_30 + 8;
  local_40 = (uchar *)0x0;
  local_48 = (uchar *)0x0;
  local_50 = (uchar *)0x0;
  local_20 = local_30;
  do {
    uVar5 = local_20 + 8 < local_38 && local_30 <= local_20;
    if (local_20 + 8 >= local_38 || local_30 > local_20) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13e96e);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd50,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd48);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffd58,(difference_type)in_stack_fffffffffffffd50);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffda8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )in_stack_fffffffffffffda0._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )in_stack_fffffffffffffd98._M_current);
      for (local_e0 = 0;
          sVar3 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size(local_18), local_e0 < sVar3; local_e0 = local_e0 + 1) {
        in_stack_fffffffffffffda8._M_current = (uchar *)&local_a8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd50,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd48);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](local_18,local_e0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48)
        ;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](local_18,local_e0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                   in_stack_fffffffffffffd98);
      }
      __last._M_current = (uchar *)&local_a8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd50,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd48);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffd58,(difference_type)in_stack_fffffffffffffd50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffd58,(difference_type)in_stack_fffffffffffffd50);
      __first = std::vector<unsigned_char,std::allocator<unsigned_char>>::
                insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffd90,in_stack_fffffffffffffda8,
                           in_stack_fffffffffffffda0._M_current,__last._M_current);
      local_148 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
      while (this = local_148,
            pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     std::
                     vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::size(local_18 + 1), this < pvVar4) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd50,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd48);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](local_18 + 1,(size_type)local_148);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48)
        ;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](local_18 + 1,(size_type)local_148);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  (this,in_stack_fffffffffffffda8,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )__first._M_current,__last);
        local_148 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)&(local_148->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd50,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd48);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffd58,(difference_type)in_stack_fffffffffffffd50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffd58,(difference_type)in_stack_fffffffffffffd50);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (this,in_stack_fffffffffffffda8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
      for (local_1b0 = 0;
          sVar3 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size(local_18 + 2), local_1b0 < sVar3; local_1b0 = local_1b0 + 1) {
        in_stack_fffffffffffffd58 = &local_a8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd50,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd48);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](local_18 + 2,local_1b0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffd48)
        ;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](local_18 + 2,local_1b0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffd48);
        in_stack_fffffffffffffd60 =
             std::vector<unsigned_char,std::allocator<unsigned_char>>::
             insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                       (this,in_stack_fffffffffffffda8,__first._M_current,__last);
      }
      pvVar4 = &local_a8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar4);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd50,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)pvVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar4);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffd58,(difference_type)in_stack_fffffffffffffd50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar4);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (this,in_stack_fffffffffffffda8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(uVar5,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8);
      local_4 = 0;
      local_90 = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffd60._M_current);
      return local_4;
    }
    lodepng_chunk_type(local_55,local_20);
    in_stack_fffffffffffffde8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 4) {
      local_28 = lodepng_chunk_next_const((uchar *)in_stack_fffffffffffffd48);
      if (local_20 < local_28) {
        bVar1 = std::operator==(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
        if (bVar1) {
          if (local_40 == (uchar *)0x0) {
            local_40 = local_20 + (8 - (long)local_30);
          }
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
          if (bVar1) {
            if (local_40 == (uchar *)0x0) {
              local_40 = local_20 + (8 - (long)local_30);
            }
            if (local_48 == (uchar *)0x0) {
              local_48 = local_20 + (8 - (long)local_30);
            }
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
            if ((bVar1) && (local_50 == (uchar *)0x0)) {
              local_50 = local_20 + (8 - (long)local_30);
            }
          }
        }
        local_20 = local_28;
        local_90 = 0;
      }
      else {
        local_4 = 1;
        local_90 = 1;
      }
    }
    else {
      local_4 = 1;
      local_90 = 1;
    }
    std::__cxx11::string::~string((string *)(local_79 + 1));
  } while (local_90 == 0);
  return local_4;
}

Assistant:

unsigned insertChunks(std::vector<unsigned char>& png,
                      const std::vector<std::vector<unsigned char> > chunks[3]) {
  const unsigned char *chunk, *next, *begin, *end;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  long l0 = 0; //location 0: IHDR-l0-PLTE (or IHDR-l0-l1-IDAT)
  long l1 = 0; //location 1: PLTE-l1-IDAT (or IHDR-l0-l1-IDAT)
  long l2 = 0; //location 2: IDAT-l2-IEND

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    std::string name(type);
    if(name.size() != 4) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow

    if(name == "PLTE") {
      if(l0 == 0) l0 = chunk - begin + 8;
    } else if(name == "IDAT") {
      if(l0 == 0) l0 = chunk - begin + 8;
      if(l1 == 0) l1 = chunk - begin + 8;
    } else if(name == "IEND") {
      if(l2 == 0) l2 = chunk - begin + 8;
    }

    chunk = next;
  }

  std::vector<unsigned char> result;
  result.insert(result.end(), png.begin(), png.begin() + l0);
  for(size_t i = 0; i < chunks[0].size(); i++) result.insert(result.end(), chunks[0][i].begin(), chunks[0][i].end());
  result.insert(result.end(), png.begin() + l0, png.begin() + l1);
  for(size_t i = 0; i < chunks[1].size(); i++) result.insert(result.end(), chunks[1][i].begin(), chunks[1][i].end());
  result.insert(result.end(), png.begin() + l1, png.begin() + l2);
  for(size_t i = 0; i < chunks[2].size(); i++) result.insert(result.end(), chunks[2][i].begin(), chunks[2][i].end());
  result.insert(result.end(), png.begin() + l2, png.end());

  png = result;
  return 0;
}